

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc_main.cpp
# Opt level: O0

void Error(FlatCompiler *flatc,string *err,bool usage,bool show_exe_name)

{
  char *__s;
  FILE *pFVar1;
  string *this;
  undefined8 uVar2;
  allocator<char> local_61;
  string local_60;
  string local_40;
  undefined1 local_1a;
  byte local_19;
  bool show_exe_name_local;
  string *psStack_18;
  bool usage_local;
  string *err_local;
  FlatCompiler *flatc_local;
  
  local_1a = show_exe_name;
  local_19 = usage;
  psStack_18 = err;
  err_local = (string *)flatc;
  if (show_exe_name) {
    printf("%s: ",g_program_name);
  }
  this = err_local;
  pFVar1 = _stderr;
  __s = g_program_name;
  if (((local_19 & 1) != 0) && (err_local != (string *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
    flatbuffers::FlatCompiler::GetShortUsageString(&local_40,(FlatCompiler *)this,&local_60);
    uVar2 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"%s\n",uVar2);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  pFVar1 = _stderr;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"\nerror:\n  %s\n\n",uVar2);
  exit(1);
}

Assistant:

static void Error(const flatbuffers::FlatCompiler *flatc,
                  const std::string &err, bool usage, bool show_exe_name) {
  if (show_exe_name) { printf("%s: ", g_program_name); }
  if (usage && flatc) {
    fprintf(stderr, "%s\n", flatc->GetShortUsageString(g_program_name).c_str());
  }
  fprintf(stderr, "\nerror:\n  %s\n\n", err.c_str());
  exit(1);
}